

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::Canceler::release(Canceler *this)

{
  long lVar1;
  
  while (lVar1 = *(long *)this, lVar1 != 0) {
    *(undefined8 *)this = *(undefined8 *)(lVar1 + 0x10);
    *(undefined8 *)(lVar1 + 8) = 0;
    *(undefined8 *)(lVar1 + 0x10) = 0;
  }
  return;
}

Assistant:

void Canceler::release() {
  for (;;) {
    KJ_IF_MAYBE(a, list) {
      list = a->next;
      a->prev = nullptr;
      a->next = nullptr;
    } else {
      break;
    }
  }